

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

size_t MuxImageDiskSize(WebPMuxImage *wpi)

{
  size_t sVar1;
  long *in_RDI;
  size_t size;
  WebPChunk *chunk;
  
  chunk = (WebPChunk *)0x0;
  if (*in_RDI != 0) {
    sVar1 = ChunkDiskSize((WebPChunk *)0x0);
    chunk = (WebPChunk *)((long)&chunk->tag_ + sVar1);
  }
  if (in_RDI[1] != 0) {
    sVar1 = ChunkDiskSize(chunk);
    chunk = (WebPChunk *)((long)&chunk->tag_ + sVar1);
  }
  if (in_RDI[2] != 0) {
    sVar1 = ChunkDiskSize(chunk);
    chunk = (WebPChunk *)((long)&chunk->tag_ + sVar1);
  }
  if (in_RDI[3] != 0) {
    sVar1 = ChunkListDiskSize(chunk);
    chunk = (WebPChunk *)((long)&chunk->tag_ + sVar1);
  }
  return (size_t)chunk;
}

Assistant:

size_t MuxImageDiskSize(const WebPMuxImage* const wpi) {
  size_t size = 0;
  if (wpi->header_ != NULL) size += ChunkDiskSize(wpi->header_);
  if (wpi->alpha_ != NULL) size += ChunkDiskSize(wpi->alpha_);
  if (wpi->img_ != NULL) size += ChunkDiskSize(wpi->img_);
  if (wpi->unknown_ != NULL) size += ChunkListDiskSize(wpi->unknown_);
  return size;
}